

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O1

void curses_display_buffer(char *inbuf,nh_bool trymove)

{
  nh_menuitem_conflict *pnVar1;
  char cVar2;
  uint uVar3;
  char *__ptr;
  nh_menuitem_conflict *items;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  char *__s;
  int iVar7;
  char *__dest;
  uint uVar8;
  long lVar9;
  char linebuf [256];
  char buf [256];
  char local_238 [255];
  undefined1 local_139;
  char local_138 [264];
  
  __ptr = strdup(inbuf);
  items = (nh_menuitem_conflict *)malloc(0xa78);
  if (*__ptr == '\0') {
    lVar9 = 0;
LAB_00117fad:
    curses_display_menu(items,(wchar_t)lVar9,(char *)0x0,L'\0',(wchar_t *)0x0);
    free(items);
    free(__ptr);
    return;
  }
  iVar7 = 10;
  lVar9 = 0;
  __s = __ptr;
LAB_00117e3e:
  __dest = local_238;
  pcVar4 = strchr(__s,10);
  if (pcVar4 != (char *)0x0) {
    if ((__s < pcVar4) && (pcVar4[-1] == '\r')) {
      pcVar4[-1] = '\0';
    }
    *pcVar4 = '\0';
  }
  strncpy(__dest,__s,0x100);
  local_139 = 0;
  pcVar5 = strchr(__dest,9);
  if ((pcVar5 != (char *)0x0) && (local_238[0] != '\0')) {
    uVar8 = 0;
    pcVar5 = local_138;
    do {
      cVar2 = *__dest;
      if (cVar2 == '\t') {
        memset(pcVar5,0x20,(ulong)(8 - (uVar8 & 7)));
        uVar3 = (uint)(byte)((byte)uVar8 ^ 7);
        pcVar5 = pcVar5 + (uVar3 & 7);
        uVar8 = uVar8 + (uVar3 & 7);
      }
      else {
        if (cVar2 == '\0') goto LAB_00117f0c;
        *pcVar5 = cVar2;
      }
      uVar8 = uVar8 + 1;
      pcVar5 = pcVar5 + 1;
      __dest = __dest + 1;
    } while( true );
  }
  goto LAB_00117f30;
LAB_00117f0c:
  *pcVar5 = '\0';
  strcpy(local_238,local_138);
LAB_00117f30:
  if (iVar7 <= lVar9) {
    iVar7 = iVar7 * 2;
    items = (nh_menuitem_conflict *)realloc(items,(long)iVar7 * 0x10c);
  }
  pnVar1 = items + lVar9;
  pnVar1->id = L'\0';
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,local_238);
  if (pcVar4 == (char *)0x0) {
    sVar6 = strlen(__s);
    __s = __s + sVar6;
  }
  else {
    __s = pcVar4 + 1;
  }
  lVar9 = lVar9 + 1;
  if (*__s == '\0') goto LAB_00117fad;
  goto LAB_00117e3e;
}

Assistant:

void curses_display_buffer(const char *inbuf, nh_bool trymove)
{
    char *line, *line_end, *buf;
    char linebuf[BUFSZ];
    int icount, size;
    struct nh_menuitem *items;

    buf = strdup(inbuf);
    icount = 0;
    size = 10;
    items = malloc(size * sizeof(struct nh_menuitem));

    line = buf;
    while (*line) {
	line_end = strchr(line, '\n');
	if (line_end) {
	    /* deal with the CR that Windows adds to the LF */
	    if (line_end > line && *(line_end - 1) == '\r')
		*(line_end - 1) = '\0';
	    *line_end = '\0';
	}

	strncpy(linebuf, line, BUFSZ);
	linebuf[BUFSZ - 1] = '\0';
	if (strchr(linebuf, '\t') != 0)
	    tabexpand(linebuf);
	add_menu_txt(items, size, icount, linebuf, MI_TEXT);

	if (line_end) {
	    line = line_end + 1;
	} else {
	    /* null terminator guaranteed if earlier strdup() succeeded */
	    line = strchr(line, '\0');
	}
    }

    curses_display_menu(items, icount, NULL, PICK_NONE, NULL);
    free(items);
    free(buf);
}